

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_irreg_distr(Integer g_a,Integer *mapc,Integer *nblock)

{
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  }
  if (GA[lVar5].ndim < 1) {
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  }
  if (0 < GA[lVar5].ndim) {
    lVar6 = 0;
    do {
      if (GA[g_a + 1000].dims[lVar6] < nblock[lVar6]) {
        pnga_error("number of blocks must be <= corresponding dimension",lVar6);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < GA[lVar5].ndim);
  }
  lVar6 = (long)GA[lVar5].ndim;
  if (0 < lVar6) {
    lVar3 = 0;
    lVar7 = 0;
    do {
      lVar6 = mapc[lVar7];
      if ((lVar6 < 1) || (GA[lVar5].dims[lVar3] + 1 < lVar6)) {
        pnga_error("Mapc entry outside array dimension limits",lVar6);
      }
      if (nblock[lVar3] < 2) {
        lVar7 = lVar7 + 1;
      }
      else {
        lVar4 = 1;
        do {
          if (mapc[lVar7 + lVar4] < lVar6) {
            pnga_error("Mapc entries are not properly monotonic",lVar6);
          }
          lVar6 = mapc[lVar7 + lVar4];
          if ((lVar6 < 1) || (GA[lVar5].dims[lVar3] + 1 < lVar6)) {
            pnga_error("Mapc entry outside array dimension limits",lVar6);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < nblock[lVar3]);
        lVar7 = lVar7 + lVar4;
      }
      lVar3 = lVar3 + 1;
      lVar6 = (long)GA[lVar5].ndim;
    } while (lVar3 < lVar6);
  }
  pgVar1 = GA;
  if (lVar6 < 1) {
    lVar3 = 0;
  }
  else {
    lVar7 = 0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + nblock[lVar7];
      pgVar1[g_a + 1000].nblock[lVar7] = (int)nblock[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  pCVar2 = (C_Integer *)malloc(lVar3 * 8 + 8);
  pgVar1[lVar5].mapc = pCVar2;
  if (0 < lVar3) {
    pCVar2 = GA[lVar5].mapc;
    lVar6 = 0;
    do {
      pCVar2[lVar6] = mapc[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  pgVar1 = GA;
  GA[lVar5].mapc[lVar3] = -1;
  pgVar1[lVar5].irreg = 1;
  return;
}

Assistant:

void pnga_set_irreg_distr(Integer g_a, Integer *mapc, Integer *nblock)
{
  Integer i, j, ichk, maplen;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblock[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblock[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblock[i];
    GA[ga_handle].nblock[i] = (C_Integer)nblock[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;
}